

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall Builder::Build(Builder *this,string *err)

{
  Status *pSVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  pointer pCVar5;
  DryRunCommandRunner *this_00;
  RealCommandRunner *this_01;
  Edge *this_02;
  BuildLog *this_03;
  byte local_d1;
  int local_9c;
  undefined1 local_98 [8];
  Result result;
  string local_60;
  Edge *local_40;
  Edge *edge;
  bool can_run_more;
  int local_28;
  int local_24;
  int failures_allowed;
  int pending_commands;
  string *err_local;
  Builder *this_local;
  
  _failures_allowed = err;
  err_local = (string *)this;
  bVar2 = AlreadyUpToDate(this);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!AlreadyUpToDate()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build.cc",
                  0x289,"bool Builder::Build(string *)");
  }
  pSVar1 = this->status_;
  uVar3 = Plan::command_edge_count(&this->plan_);
  (**pSVar1->_vptr_Status)(pSVar1,(ulong)uVar3);
  local_24 = 0;
  local_28 = *(int *)(this->config_ + 0x10);
  pCVar5 = std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::get
                     (&this->command_runner_);
  if (pCVar5 == (pointer)0x0) {
    if (((byte)this->config_[4] & 1) == 0) {
      this_01 = (RealCommandRunner *)operator_new(0x308);
      RealCommandRunner::RealCommandRunner(this_01,this->config_);
      std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::reset
                (&this->command_runner_,(pointer)this_01);
    }
    else {
      this_00 = (DryRunCommandRunner *)operator_new(0x58);
      anon_unknown.dwarf_2549a::DryRunCommandRunner::DryRunCommandRunner(this_00);
      std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::reset
                (&this->command_runner_,(pointer)this_00);
    }
  }
  (*this->status_->_vptr_Status[4])();
LAB_0010fc89:
  do {
    bVar2 = Plan::more_to_do(&this->plan_);
    if (!bVar2) {
      (*this->status_->_vptr_Status[5])();
      this_local._7_1_ = 1;
      goto LAB_001100f3;
    }
    local_d1 = 0;
    if (local_28 != 0) {
      bVar2 = Plan::more_ready(&this->plan_);
      local_d1 = 0;
      if (bVar2) {
        pCVar5 = std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::operator->
                           (&this->command_runner_);
        iVar4 = (*pCVar5->_vptr_CommandRunner[2])();
        local_d1 = (byte)iVar4;
      }
    }
    edge._3_1_ = local_d1 & 1;
    if (edge._3_1_ != 0) {
      pCVar5 = std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::operator->
                         (&this->command_runner_);
      uVar3 = (*pCVar5->_vptr_CommandRunner[3])();
      if ((uVar3 & 1) != 0) {
        this_02 = Plan::FindWork(&this->plan_);
        local_40 = this_02;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,"generator",
                   (allocator<char> *)(result.output.field_2._M_local_buf + 0xf));
        bVar2 = Edge::GetBindingBool(this_02,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(result.output.field_2._M_local_buf + 0xf));
        if (bVar2) {
          this_03 = DependencyScan::build_log(&this->scan_);
          BuildLog::Close(this_03);
        }
        bVar2 = StartEdge(this,local_40,_failures_allowed);
        if (!bVar2) {
          Cleanup(this);
          (*this->status_->_vptr_Status[5])();
          this_local._7_1_ = 0;
          goto LAB_001100f3;
        }
        bVar2 = Edge::is_phony(local_40);
        if (bVar2) {
          bVar2 = Plan::EdgeFinished(&this->plan_,local_40,kEdgeSucceeded,_failures_allowed);
          if (!bVar2) {
            Cleanup(this);
            (*this->status_->_vptr_Status[5])();
            this_local._7_1_ = 0;
            goto LAB_001100f3;
          }
        }
        else {
          local_24 = local_24 + 1;
        }
        goto LAB_0010fc89;
      }
    }
    if (local_24 == 0) {
      (*this->status_->_vptr_Status[5])();
      if (local_28 == 0) {
        if (*(int *)(this->config_ + 0x10) < 2) {
          std::__cxx11::string::operator=((string *)_failures_allowed,"subcommand failed");
        }
        else {
          std::__cxx11::string::operator=((string *)_failures_allowed,"subcommands failed");
        }
      }
      else if (local_28 < *(int *)(this->config_ + 0x10)) {
        std::__cxx11::string::operator=
                  ((string *)_failures_allowed,"cannot make progress due to previous errors");
      }
      else {
        std::__cxx11::string::operator=((string *)_failures_allowed,"stuck [this is a bug]");
      }
      this_local._7_1_ = 0;
      goto LAB_001100f3;
    }
    CommandRunner::Result::Result((Result *)local_98);
    pCVar5 = std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::operator->
                       (&this->command_runner_);
    uVar3 = (*pCVar5->_vptr_CommandRunner[5])(pCVar5,(Result *)local_98,(ulong)(edge._3_1_ & 1));
    if (((uVar3 & 1) == 0) || ((int)result.edge == 3)) {
      Cleanup(this);
      (*this->status_->_vptr_Status[5])();
      std::__cxx11::string::operator=((string *)_failures_allowed,"interrupted by user");
      this_local._7_1_ = 0;
      local_9c = 1;
    }
    else if ((int)result.edge == 2) {
      local_9c = 2;
    }
    else {
      local_24 = local_24 + -1;
      bVar2 = FinishCommand(this,(Result *)local_98,_failures_allowed);
      if (bVar2) {
        bVar2 = CommandRunner::Result::success((Result *)local_98);
        if ((!bVar2) && (local_28 != 0)) {
          local_28 = local_28 + -1;
        }
        local_9c = 2;
      }
      else {
        Cleanup(this);
        (*this->status_->_vptr_Status[5])();
        this_local._7_1_ = 0;
        local_9c = 1;
      }
    }
    CommandRunner::Result::~Result((Result *)local_98);
    if (local_9c == 1) {
LAB_001100f3:
      return (bool)(this_local._7_1_ & 1);
    }
  } while( true );
}

Assistant:

bool Builder::Build(string* err) {
  assert(!AlreadyUpToDate());

  status_->PlanHasTotalEdges(plan_.command_edge_count());
  int pending_commands = 0;
  int failures_allowed = config_.failures_allowed;

  // Set up the command runner if we haven't done so already.
  if (!command_runner_.get()) {
    if (config_.dry_run)
      command_runner_.reset(new DryRunCommandRunner);
    else
      command_runner_.reset(new RealCommandRunner(config_));
  }

  // We are about to start the build process.
  status_->BuildStarted();

  // This main loop runs the entire build process.
  // It is structured like this:
  // First, we attempt to start as many commands as allowed by the
  // command runner.
  // Second, we attempt to wait for / reap the next finished command.
  while (plan_.more_to_do()) {
    // See if we can start any more commands...
    bool can_run_more =
        failures_allowed   &&
        plan_.more_ready() &&
        command_runner_->CanRunMore();

    // ... but we also need a token to do that.
    if (can_run_more && command_runner_->AcquireToken()) {
      Edge* edge = plan_.FindWork();
      if (edge->GetBindingBool("generator")) {
        scan_.build_log()->Close();
      }
      if (!StartEdge(edge, err)) {
        Cleanup();
        status_->BuildFinished();
        return false;
      }

      if (edge->is_phony()) {
        if (!plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, err)) {
          Cleanup();
          status_->BuildFinished();
          return false;
        }
      } else {
        ++pending_commands;
      }

      // We made some progress; go back to the main loop.
      continue;
    }

    // See if we can reap any finished commands.
    if (pending_commands) {
      CommandRunner::Result result;
      if (!command_runner_->WaitForCommand(&result, can_run_more) ||
          result.status == ExitInterrupted) {
        Cleanup();
        status_->BuildFinished();
        *err = "interrupted by user";
        return false;
      }

      // We might be able to start another command; start the main loop over.
      if (result.status == ExitTokenAvailable)
        continue;

      --pending_commands;
      if (!FinishCommand(&result, err)) {
        Cleanup();
        status_->BuildFinished();
        return false;
      }

      if (!result.success()) {
        if (failures_allowed)
          failures_allowed--;
      }

      // We made some progress; start the main loop over.
      continue;
    }

    // If we get here, we cannot make any more progress.
    status_->BuildFinished();
    if (failures_allowed == 0) {
      if (config_.failures_allowed > 1)
        *err = "subcommands failed";
      else
        *err = "subcommand failed";
    } else if (failures_allowed < config_.failures_allowed)
      *err = "cannot make progress due to previous errors";
    else
      *err = "stuck [this is a bug]";

    return false;
  }

  status_->BuildFinished();
  return true;
}